

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nicdrv.c
# Opt level: O0

int ecx_setupnic(ecx_portt *port,char *ifname,int secondary)

{
  char *pcVar1;
  undefined4 uVar2;
  uint16_t uVar3;
  int iVar4;
  int *local_90;
  int *psock;
  undefined4 local_80;
  sockaddr_ll sll;
  ifreq ifr;
  timeval timeout;
  uint local_30;
  int ifindex;
  int rval;
  int r;
  int i;
  int secondary_local;
  char *ifname_local;
  ecx_portt *port_local;
  
  r = secondary;
  _i = ifname;
  ifname_local = (char *)port;
  if (secondary == 0) {
    pthread_mutex_init((pthread_mutex_t *)&port->getindex_mutex,(pthread_mutexattr_t *)0x0);
    pthread_mutex_init((pthread_mutex_t *)(ifname_local + 0xcae0),(pthread_mutexattr_t *)0x0);
    pthread_mutex_init((pthread_mutex_t *)(ifname_local + 0xcb08),(pthread_mutexattr_t *)0x0);
    ifname_local[0x38] = -1;
    ifname_local[0x39] = -1;
    ifname_local[0x3a] = -1;
    ifname_local[0x3b] = -1;
    ifname_local[0xcaa4] = '\0';
    ifname_local[0xcaa5] = '\0';
    ifname_local[0xcaa6] = '\0';
    ifname_local[0xcaa7] = '\0';
    ifname_local[0xcaa8] = '\0';
    ifname_local[0xcaa9] = '\0';
    ifname_local[0xcaaa] = '\0';
    ifname_local[0xcaab] = '\0';
    *(char **)ifname_local = ifname_local + 0x38;
    *(char **)(ifname_local + 8) = ifname_local + 26000;
    *(char **)(ifname_local + 0x10) = ifname_local + 0xc470;
    *(char **)(ifname_local + 0x18) = ifname_local + 0x5f9c;
    *(char **)(ifname_local + 0x20) = ifname_local + 0x3c;
    *(char **)(ifname_local + 0x28) = ifname_local + 0x5f1c;
    *(char **)(ifname_local + 0x30) = ifname_local + 0x5f5c;
    local_90 = (int *)(ifname_local + 0x38);
  }
  else {
    if (port->redport == (ecx_redportt *)0x0) {
      return 0;
    }
    local_90 = &port->redport->sockhandle;
    *local_90 = -1;
    port->redstate = 1;
    (port->redport->stack).sock = &port->redport->sockhandle;
    (port->redport->stack).txbuf = &port->txbuf;
    (port->redport->stack).txbuflength = &port->txbuflength;
    (port->redport->stack).tempbuf = &port->redport->tempinbuf;
    (port->redport->stack).rxbuf = &port->redport->rxbuf;
    (port->redport->stack).rxbufstat = &port->redport->rxbufstat;
    (port->redport->stack).rxsa = &port->redport->rxsa;
  }
  uVar3 = htons(0x88a4);
  iVar4 = socket(0x11,3,(uint)uVar3);
  *local_90 = iVar4;
  ifr.ifr_ifru._16_8_ = 0;
  setsockopt(*local_90,1,0x14,(void *)((long)&ifr.ifr_ifru + 0x10),0x10);
  setsockopt(*local_90,1,0x15,(void *)((long)&ifr.ifr_ifru + 0x10),0x10);
  rval = 1;
  setsockopt(*local_90,1,5,&rval,4);
  strcpy((char *)sll.sll_addr,_i);
  ioctl(*local_90,0x8933,sll.sll_addr);
  uVar2 = ifr.ifr_ifrn._8_4_;
  strcpy((char *)sll.sll_addr,_i);
  ifr.ifr_ifrn._8_4_ = ifr.ifr_ifrn._8_4_ & 0xffff0000;
  ioctl(*local_90,0x8913,sll.sll_addr);
  ifr.ifr_ifrn._8_2_ = 1;
  ioctl(*local_90,0x8913,sll.sll_addr);
  psock._4_2_ = 0x11;
  local_80 = uVar2;
  psock._6_2_ = htons(0x88a4);
  iVar4 = bind(*local_90,(sockaddr *)((long)&psock + 4),0x14);
  for (rval = 0; rval < 0x10; rval = rval + 1) {
    ec_setupheader(ifname_local + (long)rval * 0x5ee + 26000);
    pcVar1 = ifname_local + (long)rval * 4 + 0x5f1c;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
  }
  ec_setupheader(ifname_local + 0xc4b0);
  local_30 = (uint)(iVar4 == 0);
  return local_30;
}

Assistant:

int ecx_setupnic(ecx_portt *port, const char *ifname, int secondary) 
{
   int i;
   int r, rval, ifindex;
   struct timeval timeout;
   struct ifreq ifr;
   struct sockaddr_ll sll;
   int *psock;

   rval = 0;
   if (secondary)
   {
      /* secondary port stuct available? */
      if (port->redport)
      {
         /* when using secondary socket it is automatically a redundant setup */
         psock = &(port->redport->sockhandle);
         *psock = -1;
         port->redstate                   = ECT_RED_DOUBLE;
         port->redport->stack.sock        = &(port->redport->sockhandle);
         port->redport->stack.txbuf       = &(port->txbuf);
         port->redport->stack.txbuflength = &(port->txbuflength);
         port->redport->stack.tempbuf     = &(port->redport->tempinbuf);
         port->redport->stack.rxbuf       = &(port->redport->rxbuf);
         port->redport->stack.rxbufstat   = &(port->redport->rxbufstat);
         port->redport->stack.rxsa        = &(port->redport->rxsa);
      }
      else
      {
         /* fail */
         return 0;
      }
   }
   else
   {

#ifdef RTNET
      rt_mutex_create(&port->getindex_mutex, "getindex_mutex");
      rt_mutex_create(&port->tx_mutex, "tx_mutex");
      rt_mutex_create(&port->rx_mutex, "rx_mutex");
#else
      pthread_mutex_init(&(port->getindex_mutex), NULL);
      pthread_mutex_init(&(port->tx_mutex)      , NULL);
      pthread_mutex_init(&(port->rx_mutex)      , NULL);
#endif //RTNET

      port->sockhandle        = -1;
      port->lastidx           = 0;
      port->redstate          = ECT_RED_NONE;
      port->stack.sock        = &(port->sockhandle);
      port->stack.txbuf       = &(port->txbuf);
      port->stack.txbuflength = &(port->txbuflength);
      port->stack.tempbuf     = &(port->tempinbuf);
      port->stack.rxbuf       = &(port->rxbuf);
      port->stack.rxbufstat   = &(port->rxbufstat);
      port->stack.rxsa        = &(port->rxsa);
      psock = &(port->sockhandle);
   }   
   /* we use RAW packet socket, with packet type ETH_P_ECAT */
   *psock = SOCKET(PF_PACKET, SOCK_RAW, htons(ETH_P_ECAT));
   
   timeout.tv_sec =  0;
   timeout.tv_usec = 1; 
   r = SETSOCKOPT(*psock, SOL_SOCKET, SO_RCVTIMEO, &timeout, sizeof(timeout));
   r = SETSOCKOPT(*psock, SOL_SOCKET, SO_SNDTIMEO, &timeout, sizeof(timeout));
   i = 1;
   r = SETSOCKOPT(*psock, SOL_SOCKET, SO_DONTROUTE, &i, sizeof(i));
   /* connect socket to NIC by name */
   strcpy(ifr.ifr_name, ifname);
   r = IOCTL(*psock, SIOCGIFINDEX, &ifr);
   ifindex = ifr.ifr_ifindex;
   strcpy(ifr.ifr_name, ifname);
   ifr.ifr_flags = 0;
   /* reset flags of NIC interface */
   r = IOCTL(*psock, SIOCGIFFLAGS, &ifr);
   /* set flags of NIC interface, here promiscuous and broadcast */
   ifr.ifr_flags = ifr.ifr_flags || IFF_PROMISC || IFF_BROADCAST;
   r = IOCTL(*psock, SIOCGIFFLAGS, &ifr);
   /* bind socket to protocol, in this case RAW EtherCAT */
   sll.sll_family = AF_PACKET;
   sll.sll_ifindex = ifindex;
   sll.sll_protocol = htons(ETH_P_ECAT);
   r = BIND(*psock, (struct sockaddr *)&sll, sizeof(sll));
   /* setup ethernet headers in tx buffers so we don't have to repeat it */
   for (i = 0; i < EC_MAXBUF; i++) 
   {
      ec_setupheader(&(port->txbuf[i]));
      port->rxbufstat[i] = EC_BUF_EMPTY;
   }
   ec_setupheader(&(port->txbuf2));
   if (r == 0) rval = 1;
   
   return rval;
}